

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
          (CodedInputStream *this,uint64 *value)

{
  bool bVar1;
  uint uVar2;
  uint8 **local_30;
  uint8 *ptr;
  uint8 bytes [8];
  uint64 *value_local;
  CodedInputStream *this_local;
  
  bytes = (uint8  [8])value;
  uVar2 = BufferSize(this);
  if (uVar2 < 8) {
    bVar1 = ReadRaw(this,&ptr,8);
    if (!bVar1) {
      return false;
    }
    local_30 = &ptr;
  }
  else {
    local_30 = (uint8 **)this->buffer_;
    Advance(this,8);
  }
  ReadLittleEndian64FromArray((uint8 *)local_30,(uint64 *)bytes);
  return true;
}

Assistant:

bool CodedInputStream::ReadLittleEndian64Fallback(uint64* value) {
  uint8 bytes[sizeof(*value)];

  const uint8* ptr;
  if (BufferSize() >= sizeof(*value)) {
    // Fast path:  Enough bytes in the buffer to read directly.
    ptr = buffer_;
    Advance(sizeof(*value));
  } else {
    // Slow path:  Had to read past the end of the buffer.
    if (!ReadRaw(bytes, sizeof(*value))) return false;
    ptr = bytes;
  }
  ReadLittleEndian64FromArray(ptr, value);
  return true;
}